

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O2

mh_int_t mh_assoc_put(mh_assoc_t *h,assoc_val **node,assoc_val ***ret,void *arg)

{
  mh_int_t *pmVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  assoc_val **in_RAX;
  byte bVar8;
  uint uVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  assoc_val ***extraout_RDX_01;
  assoc_val ***extraout_RDX_02;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong local_50;
  uint local_38;
  uint local_34;
  void *arg_00;
  
  if (h->size != h->n_buckets) {
    if (h->resize_position == 0) {
      if (h->upper_bound <= h->n_dirty) {
        arg = (void *)0x0;
        uVar7 = mh_assoc_start_resize(h,h->n_buckets + 1,0,(void *)0x0);
        in_RAX = (assoc_val **)(ulong)uVar7;
        ret = extraout_RDX_02;
        if (uVar7 != 0) goto LAB_001060f0;
      }
    }
    else {
      mh_assoc_resize(h,(void *)0x0);
      ret = extraout_RDX_01;
    }
    if (h->resize_position != 0) {
      mh_assoc_put(h->shadow,node,ret,arg);
    }
    uVar3 = PMurHash32(0xd,((*node)->key).id,((*node)->key).id_len);
    uVar7 = h->n_buckets;
    uVar13 = (ulong)uVar3 % (ulong)uVar7;
    uVar9 = uVar3 % (uVar7 - 1) + 1;
    arg_00 = (void *)(ulong)uVar9;
    pmVar1 = h->b;
    while( true ) {
      uVar2 = uVar13 >> 4;
      uVar6 = pmVar1[uVar2];
      uVar14 = (uint)uVar13 & 0xf;
      uVar4 = 1 << (sbyte)uVar14;
      uVar11 = uVar13;
      if ((uVar6 >> uVar14 & 1) == 0) break;
      iVar5 = mh_cmp_eq(node,h->p + uVar13,arg_00);
      uVar12 = uVar13;
      local_50 = uVar2;
      local_38 = uVar4;
      local_34 = uVar14;
      if (iVar5 != 0) goto LAB_001060b7;
      pmVar1[uVar2] = 0x10000 << (sbyte)uVar14 | uVar6;
      uVar7 = h->n_buckets;
      uVar4 = (uint)uVar13 + uVar9;
      uVar6 = uVar7;
      if (uVar4 < uVar7) {
        uVar6 = 0;
      }
      uVar13 = (ulong)(uVar4 - uVar6);
      arg_00 = extraout_RDX;
    }
    do {
      bVar8 = (byte)uVar11 & 0xf;
      uVar12 = uVar13;
      local_50 = uVar2;
      local_38 = uVar4;
      local_34 = uVar14;
      if (((pmVar1[uVar11 >> 4] >> bVar8) >> 0x10 & 1) == 0) break;
      uVar10 = (int)uVar11 + uVar9;
      uVar6 = 0 >> bVar8;
      if (uVar7 <= uVar10) {
        uVar6 = uVar7;
      }
      uVar10 = uVar10 - uVar6;
      uVar11 = (ulong)uVar10;
      local_34 = uVar10 & 0xf;
    } while (((pmVar1[uVar10 >> 4] >> local_34 & 1) == 0) ||
            (iVar5 = mh_cmp_eq(h->p + uVar10,node,arg_00), arg_00 = extraout_RDX_00, uVar12 = uVar11
            , local_50 = (ulong)(uVar10 >> 4), local_38 = 1 << (sbyte)local_34, iVar5 == 0));
LAB_001060b7:
    if ((local_38 & pmVar1[local_50]) == 0) {
      pmVar1[local_50] = local_38 | pmVar1[local_50];
      h->size = h->size + 1;
      if (((pmVar1[local_50] >> (sbyte)local_34) >> 0x10 & 1) == 0) {
        h->n_dirty = h->n_dirty + 1;
      }
    }
    in_RAX = h->p;
    in_RAX[uVar12] = *node;
  }
LAB_001060f0:
  return (mh_int_t)in_RAX;
}

Assistant:

static inline mh_int_t
_mh(put)(struct _mh(t) *h, const mh_node_t *node, mh_node_t **ret,
	 mh_arg_t arg)
{
	mh_int_t x = mh_end(h);
	int exist;
	if (h->size == h->n_buckets)
		/* no one free elements in the hash table */
		goto put_done;

#if MH_INCREMENTAL_RESIZE
	if (mh_unlikely(h->resize_position > 0))
		_mh(resize)(h, arg);
	else if (mh_unlikely(h->n_dirty >= h->upper_bound)) {
		if (_mh(start_resize)(h, h->n_buckets + 1, 0, arg))
			goto put_done;
	}
	if (h->resize_position)
		_mh(put)(h->shadow, node, NULL, arg);
#else
	if (mh_unlikely(h->n_dirty >= h->upper_bound)) {
		if (_mh(start_resize)(h, h->n_buckets + 1, h->size,
				      arg))
			goto put_done;
	}
#endif

	x = put_slot(h, node, arg);
	exist = mh_exist(h, x);

	if (!exist) {
		/* add new */
		mh_setexist(h, x);
		h->size++;
		if (!mh_dirty(h, x))
			h->n_dirty++;

		memcpy(&(h->p[x]), node, sizeof(mh_node_t));
		if (ret)
			*ret = NULL;
	} else {
		if (ret)
			memcpy(*ret, &(h->p[x]), sizeof(mh_node_t));
		/* replace old */
		memcpy(&(h->p[x]), node, sizeof(mh_node_t));
	}

put_done:
	return x;
}